

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmessagebox.cpp
# Opt level: O1

void __thiscall QMessageBoxPrivate::initHelper(QMessageBoxPrivate *this,QPlatformDialogHelper *h)

{
  void **ppvVar1;
  undefined4 *puVar2;
  long in_FS_OFFSET;
  QObject local_68 [8];
  Connection local_60;
  code *local_58;
  ImplFn local_50;
  code *local_48;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = QPlatformMessageDialogHelper::clicked;
  local_40 = 0;
  local_58 = helperClicked;
  local_50 = (ImplFn)0x0;
  ppvVar1 = *(void ***)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
  puVar2 = (undefined4 *)operator_new(0x20);
  *puVar2 = 1;
  *(code **)(puVar2 + 2) =
       QtPrivate::
       QPrivateSlotObject<void_(QMessageBoxPrivate::*)(QPlatformDialogHelper::StandardButton,_QPlatformDialogHelper::ButtonRole),_QtPrivate::List<QPlatformDialogHelper::StandardButton,_QPlatformDialogHelper::ButtonRole>,_void>
       ::impl;
  *(code **)(puVar2 + 4) = helperClicked;
  *(undefined8 *)(puVar2 + 6) = 0;
  QObject::connectImpl
            ((QObject *)&local_60,(void **)h,(QObject *)&local_48,ppvVar1,
             (QSlotObjectBase *)&local_58,(ConnectionType)puVar2,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection(&local_60);
  ppvVar1 = *(void ***)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
  local_48 = QPlatformMessageDialogHelper::checkBoxStateChanged;
  local_40 = 0;
  puVar2 = (undefined4 *)operator_new(0x18);
  *puVar2 = 1;
  *(code **)(puVar2 + 2) =
       QtPrivate::
       QCallableObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/widgets/dialogs/qmessagebox.cpp:2771:16),_QtPrivate::List<Qt::CheckState>,_void>
       ::impl;
  *(QMessageBoxPrivate **)(puVar2 + 4) = this;
  QObject::connectImpl
            (local_68,(void **)h,(QObject *)&local_48,ppvVar1,(QSlotObjectBase *)0x0,
             (ConnectionType)puVar2,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_68);
  QPlatformMessageDialogHelper::setOptions((QSharedPointer *)h);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMessageBoxPrivate::initHelper(QPlatformDialogHelper *h)
{
    auto *messageDialogHelper = static_cast<QPlatformMessageDialogHelper *>(h);
    QObjectPrivate::connect(messageDialogHelper, &QPlatformMessageDialogHelper::clicked,
                            this, &QMessageBoxPrivate::helperClicked);
    // Forward state via lambda, so that we can handle addition and removal
    // of checkbox via setCheckBox() after initializing helper.
    QObject::connect(messageDialogHelper, &QPlatformMessageDialogHelper::checkBoxStateChanged,
        q_ptr, [this](Qt::CheckState state) {
            if (checkbox)
                checkbox->setCheckState(state);
        }
    );
    messageDialogHelper->setOptions(options);
}